

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

FLOAT_STRING_TYPE
splitFloatString(char *nptr,char **endptr,int *signal,double *fraction,int *exponential)

{
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  unsigned_long_long uVar4;
  int *piVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  char *startptr;
  int fractionSize;
  int integerSize;
  unsigned_long_long ullFraction;
  unsigned_long_long ullInteger;
  FLOAT_STRING_TYPE result;
  int *exponential_local;
  double *fraction_local;
  int *signal_local;
  char **endptr_local;
  char *nptr_local;
  
  ullInteger._4_4_ = FST_ERROR;
  _fractionSize = 0;
  startptr._0_4_ = 0;
  *endptr = nptr;
  while( true ) {
    bVar7 = true;
    if ((((**endptr != ' ') && (bVar7 = true, **endptr != '\f')) && (bVar7 = true, **endptr != '\n')
        ) && ((bVar7 = true, **endptr != '\r' && (bVar7 = true, **endptr != '\t')))) {
      bVar7 = **endptr == '\v';
    }
    if (!bVar7) break;
    *endptr = *endptr + 1;
  }
  *signal = 1;
  if (**endptr == '+') {
    *endptr = *endptr + 1;
  }
  else if (**endptr == '-') {
    *signal = -1;
    *endptr = *endptr + 1;
  }
  _Var2 = isInfinity(endptr);
  if (_Var2) {
    ullInteger._4_4_ = FST_INFINITY;
  }
  else {
    _Var2 = isNaN(endptr);
    if (_Var2) {
      ullInteger._4_4_ = FST_NAN;
    }
    else {
      if ((**endptr < '0') || ('9' < **endptr)) {
        if ((**endptr < 'a') || ('z' < **endptr)) {
          if ((**endptr < 'A') || ('Z' < **endptr)) {
            local_68 = -1;
          }
          else {
            local_68 = **endptr + -0x37;
          }
          local_64 = local_68;
        }
        else {
          local_64 = **endptr + -0x57;
        }
        local_60 = local_64;
      }
      else {
        local_60 = **endptr + -0x30;
      }
      if (-1 < local_60) {
        if ((**endptr < '0') || ('9' < **endptr)) {
          if ((**endptr < 'a') || ('z' < **endptr)) {
            if ((**endptr < 'A') || ('Z' < **endptr)) {
              local_74 = -1;
            }
            else {
              local_74 = **endptr + -0x37;
            }
            local_70 = local_74;
          }
          else {
            local_70 = **endptr + -0x57;
          }
          local_6c = local_70;
        }
        else {
          local_6c = **endptr + -0x30;
        }
        if (local_6c < 10) {
          ullInteger._4_4_ = FST_NUMBER;
          pcVar1 = *endptr;
          uVar4 = strtoull_s(pcVar1,endptr,10);
          iVar3 = (int)*endptr - (int)pcVar1;
          if ((uVar4 == 0xffffffffffffffff) && (piVar5 = __errno_location(), *piVar5 != 0)) {
            ullInteger._4_4_ = FST_OVERFLOW;
          }
          if (**endptr == '.') {
            pcVar1 = *endptr;
            _fractionSize = strtoull_s(pcVar1 + 1,endptr,10);
            startptr._0_4_ = (int)*endptr - (int)(pcVar1 + 1);
            if ((_fractionSize == 0xffffffffffffffff) && (piVar5 = __errno_location(), *piVar5 != 0)
               ) {
              ullInteger._4_4_ = FST_OVERFLOW;
            }
          }
          if ((**endptr == 'e') || (**endptr == 'E')) {
            lVar6 = strtol(*endptr + 1,endptr,10);
            *exponential = (int)lVar6;
            if ((*exponential < -0x134) || (0x134 < *exponential)) {
              ullInteger._4_4_ = FST_OVERFLOW;
            }
          }
          else {
            *exponential = 0;
          }
          if (ullInteger._4_4_ == FST_NUMBER) {
            dVar8 = pow(10.0,(double)(int)startptr);
            lVar6 = _fractionSize +
                    uVar4 * ((long)dVar8 |
                            (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f);
            auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar9._0_8_ = lVar6;
            auVar9._12_4_ = 0x45300000;
            dVar8 = pow(10.0,((double)(int)startptr + (double)iVar3) - 1.0);
            *fraction = ((auVar9._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / dVar8;
            *exponential = iVar3 + -1 + *exponential;
          }
        }
      }
    }
  }
  return ullInteger._4_4_;
}

Assistant:

static FLOAT_STRING_TYPE splitFloatString(const char* nptr, char** endptr, int *signal, double *fraction, int *exponential)
{
    FLOAT_STRING_TYPE result = FST_ERROR;

    unsigned long long ullInteger = 0;
    unsigned long long ullFraction = 0;
    int integerSize = 0;
    int fractionSize = 0;
    char* startptr;

    (*endptr) = (char*)nptr;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_018: [The white-space for strtof_s must be one of the characters ' ', '\f', '\n', '\r', '\t', '\v'.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_028: [The white-space for strtold_s must be one of the characters ' ', '\f', '\n', '\r', '\t', '\v'.]*/
    while (IS_SPACE(**endptr))
    {
        (*endptr)++;
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_019: [The valid sequence for strtof_s starts after the first non-white - space character, followed by an optional positive or negative sign, a number, 'INF', or 'NAN' (ignoring case).]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_029: [The valid sequence for strtold_s starts after the first non-white - space character, followed by an optional positive or negative sign, a number, 'INF', or 'NAN' (ignoring case).]*/
    (*signal) = +1;
    if ((**endptr) == '+')
    {
        (*endptr)++;
    }
    else if ((**endptr) == '-')
    {
        (*signal) = -1;
        (*endptr)++;
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_023: [If the string is 'INF' of 'INFINITY' (ignoring case), the strtof_s must return the INFINITY value for float.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_033: [If the string is 'INF' of 'INFINITY' (ignoring case), the strtold_s must return the INFINITY value for long double.]*/
    if (isInfinity((const char**)endptr))
    {
        result = FST_INFINITY;
    }
    /*Codes_SRS_CRT_ABSTRACTIONS_21_034: [If the string is 'NAN' or 'NAN(...)' (ignoring case), the strtold_s must return 0.0 and points endptr to the first character after the 'NAN' sequence.]*/
    /*Codes_SRS_CRT_ABSTRACTIONS_21_024: [If the string is 'NAN' or 'NAN(...)' (ignoring case), the strtof_s must return 0.0f and points endptr to the first character after the 'NAN' sequence.]*/
    else if (isNaN((const char**)endptr))
    {
        result = FST_NAN;
    }
    else if (IN_BASE_RANGE(DIGIT_VAL(**endptr), 10))
    {
        result = FST_NUMBER;
        startptr = *endptr;
        /* integers will go to the fraction and exponential. */
        ullInteger = strtoull_s(startptr, endptr, 10);
        integerSize = (int)((*endptr) - startptr);
        if ((ullInteger == ULLONG_MAX) && (errno != 0))
        {
            result = FST_OVERFLOW;
        }

        /* get the real fraction part, if exist. */
        if ((**endptr) == '.')
        {
            startptr = (*endptr) + 1;
            ullFraction = strtoull_s(startptr, endptr, 10);
            fractionSize = (int)((*endptr) - startptr);
            if ((ullFraction == ULLONG_MAX) && (errno != 0))
            {
                result = FST_OVERFLOW;
            }
        }

        if (((**endptr) == 'e') || ((**endptr) == 'E'))
        {
            startptr = (*endptr) + 1;
            (*exponential) = (int)strtol(startptr, endptr, 10);
            if (((*exponential) < (DBL_MAX_10_EXP * (-1))) || ((*exponential) > DBL_MAX_10_EXP))
            {
                result = FST_OVERFLOW;
            }
        }
        else
        {
            (*exponential) = 0;
        }

        if (result == FST_NUMBER)
        {
            /* Add ullInteger to ullFraction. */
            ullFraction += (ullInteger * (unsigned long long)(pow(10, (double)fractionSize)));
            (*fraction) = ((double)ullFraction / (pow(10.0f, ((double)fractionSize + (double)integerSize - 1.00))));

            /* Unify rest of integerSize and fractionSize in the exponential. */
            (*exponential) += integerSize - 1;
        }
    }

    return result;
}